

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpreini.cpp
# Opt level: O2

void vm_run_preinit(CVmFile *origfp,char *image_fname,CVmFile *newfp,CVmHostIfc *hostifc,
                   CVmMainClientIfc *clientifc,char **argv,int argc,
                   CVmRuntimeSymbols *runtime_symtab,CVmRuntimeSymbols *runtime_macros)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  undefined8 *puVar3;
  long *plVar4;
  long seekpos;
  CVmImageLoader *loader;
  CVmImageFile *imagefp;
  vm_globals *vmg__;
  err_frame_t err_cur__;
  vm_init_options local_50;
  
  loader = (CVmImageLoader *)0x0;
  imagefp = (CVmImageFile *)0x0;
  local_50.charset = (char *)0x0;
  local_50.log_charset = (char *)0x0;
  local_50.hostifc = hostifc;
  local_50.clientifc = clientifc;
  vm_initialize(&vmg__,&local_50);
  (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[4])(G_console_X,0);
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    seekpos = CVmFile::get_pos(origfp);
    imagefp = (CVmImageFile *)operator_new(0x20);
    imagefp->_vptr_CVmImageFile = (_func_int **)&PTR__CVmImageFileExt_0031d3e8;
    imagefp[1]._vptr_CVmImageFile = (_func_int **)origfp;
    imagefp[2]._vptr_CVmImageFile = (_func_int **)0x0;
    imagefp[3]._vptr_CVmImageFile = (_func_int **)0x0;
    loader = (CVmImageLoader *)operator_new(0x98);
    CVmImageLoader::CVmImageLoader(loader,imagefp,image_fname,0);
    CVmImageLoader::load(loader);
    G_preinit_mode_X = 1;
    CVmImageLoader::run(loader,argv,argc,runtime_symtab,runtime_macros,(char *)0x0);
    CVmFile::set_pos(origfp,seekpos);
    vm_rewrite_image(origfp,newfp,loader->static_cs_ofs_);
  }
  if (err_cur__.state_ == 1) {
    err_cur__.state_ = 2;
    if ((err_cur__.exc_)->error_code_ == 0x8fe) {
      err_throw(0x2973);
    }
    err_rethrow();
  }
  if (-1 < (short)err_cur__.state_) {
    err_cur__.state_ = err_cur__.state_ | 0x8000;
    if (loader != (CVmImageLoader *)0x0) {
      CVmImageLoader::unload(loader);
      if (loader != (CVmImageLoader *)0x0) {
        CVmImageLoader::~CVmImageLoader(loader);
      }
      operator_delete(loader,0x98);
    }
    if ((imagefp != (CVmImageFile *)0x0) && (imagefp != (CVmImageFile *)0x0)) {
      (*imagefp->_vptr_CVmImageFile[1])();
    }
    vm_terminate(vmg__,clientifc);
  }
  peVar1 = err_cur__.prv_;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = peVar1;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pCVar2 = err_cur__.exc_;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar4 + 0x10) = pCVar2;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  return;
}

Assistant:

void vm_run_preinit(CVmFile *origfp, const char *image_fname,
                    CVmFile *newfp, class CVmHostIfc *hostifc,
                    class CVmMainClientIfc *clientifc, 
                    const char *const *argv, int argc,
                    class CVmRuntimeSymbols *runtime_symtab,
                    class CVmRuntimeSymbols *runtime_macros)
{
    vm_globals *vmg__;
    CVmImageLoader *volatile loader = 0;
    CVmImageFile *volatile imagefp = 0;

    /* initialize the VM */
    vm_init_options opts(hostifc, clientifc);
    vm_initialize(&vmg__, &opts);

    /* 
     *   turn off "more" on the console - when running preinitialization,
     *   any output is purely diagnostic information for the programmer
     *   and thus should be formatted as simple stdio-style console output 
     */
    G_console->set_more_state(FALSE);

    err_try
    {
        /* note where the image file starts */
        long start_pos = origfp->get_pos();
        
        /* create the loader */
        imagefp = new CVmImageFileExt(origfp);
        loader = new CVmImageLoader(imagefp, image_fname, 0);

        /* load the image */
        loader->load(vmg0_);

        /* set pre-init mode */
        G_preinit_mode = TRUE;

        /* run it, using the runtime symbols the caller sent us */
        loader->run(vmg_ argv, argc, runtime_symtab, runtime_macros, 0);

        /* 
         *   seek back to the start of the image file, since we need to
         *   copy parts of the original file to the new file 
         */
        origfp->set_pos(start_pos);

        /* save the new image file */
        vm_rewrite_image(vmg_ origfp, newfp, loader->get_static_cs_ofs());
    }